

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

void __thiscall ImgfsFile::markchunk(ImgfsFile *this,uint64_t ofs,uint size,chunktype_t type)

{
  chunktype_t *pcVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar6;
  __normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>
  _Var7;
  undefined4 extraout_var_01;
  string *__return_storage_ptr__;
  undefined8 *puVar8;
  ulong uVar9;
  chunktype_t *__s;
  ulong __new_size;
  uint uVar11;
  chunktype_t *pcVar12;
  string str;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  uint64_t local_38;
  pointer pcVar10;
  
  if (size == 0) {
    __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
    stringformat_abi_cxx11_
              (__return_storage_ptr__,"can\'t mark empty chunk @%08llx, \'%c\'",ofs,
               (ulong)(uint)(int)(char)type);
  }
  else {
    iVar5 = (*((this->_rd).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_ReadWriter[6])();
    if ((ofs < CONCAT44(extraout_var,iVar5)) &&
       (iVar5 = (*((this->_rd).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  _vptr_ReadWriter[6])(), size + ofs <= CONCAT44(extraout_var_00,iVar5))) {
      uVar2 = (this->_hdr).bytesperchunk;
      uVar9 = CONCAT44(0,uVar2);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar9;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = ofs;
      uVar6 = SUB168(auVar4 / auVar3,0);
      if (ofs % uVar9 == 0) {
        local_38 = ofs;
        if (uVar6 >> 0x20 != 0) {
          puVar8 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar8 = "markchunk: offset too large";
          __cxa_throw(puVar8,&char_const*::typeinfo,0);
        }
        uVar11 = (uVar2 - 1 | size - 1) + 1;
        uVar9 = uVar11 / uVar9;
        pcVar10 = (this->_chunkmap).
                  super__Vector_base<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        __new_size = (ulong)(uint)((int)uVar9 + SUB164(auVar4 / auVar3,0));
        if ((ulong)((long)(this->_chunkmap).
                          super__Vector_base<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar10) < __new_size)
        {
          local_58 = (undefined1 *)CONCAT71(local_58._1_7_,0x20);
          std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>::resize
                    (&this->_chunkmap,__new_size,(value_type *)&local_58);
          pcVar10 = (this->_chunkmap).
                    super__Vector_base<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        __s = pcVar10 + uVar6;
        if (type != FREECHUNK) {
          pcVar1 = __s + uVar9;
          _Var7 = std::
                  __find_if<__gnu_cxx::__normal_iterator<ImgfsFile::chunktype_t*,std::vector<ImgfsFile::chunktype_t,std::allocator<ImgfsFile::chunktype_t>>>,__gnu_cxx::__ops::_Iter_pred<ImgfsFile::markchunk(unsigned_long,unsigned_int,ImgfsFile::chunktype_t)::_lambda(ImgfsFile::chunktype_t)_1_>>
                            (__s,pcVar1);
          if (_Var7._M_current != pcVar1) {
            printf("markchunk, n=%d, type=%c\n",uVar9,(ulong)(uint)(int)(char)type);
            local_58 = &local_48;
            local_50 = 0;
            local_48 = 0;
            if (uVar2 <= uVar11) {
              pcVar12 = __s;
              do {
                std::__cxx11::string::push_back((char)&local_58);
                pcVar12 = pcVar12 + 1;
              } while (pcVar12 != pcVar1);
            }
            printf("chunk %08llx+%08x is already: \'%s\'\n",local_38,(ulong)uVar11,local_58);
            if (local_58 != &local_48) {
              operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
            }
          }
        }
        if (uVar2 <= uVar11) {
          memset(__s,(uint)type,uVar9);
        }
        return;
      }
      __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
      stringformat_abi_cxx11_(__return_storage_ptr__,"unaligned chunk @%08llx",ofs);
    }
    else {
      __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
      iVar5 = (*((this->_rd).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_ReadWriter[6])();
      stringformat_abi_cxx11_
                (__return_storage_ptr__,"chunk @%08llx+%08x outside of file [filesize=%llx]",ofs,
                 (ulong)size,CONCAT44(extraout_var_01,iVar5));
    }
  }
  __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void markchunk(uint64_t ofs, unsigned size, chunktype_t type)
    {
        if (size==0)
            throw stringformat("can't mark empty chunk @%08llx, '%c'", ofs, type);
        if (ofs>=_rd->size() || ofs+size > _rd->size())
            throw stringformat("chunk @%08llx+%08x outside of file [filesize=%llx]", ofs, size, _rd->size());
        if (ofs%_hdr.bytesperchunk)
            throw stringformat("unaligned chunk @%08llx", ofs);

        size= roundtochunk(size);

        if ((ofs/_hdr.bytesperchunk)>>32)
            throw "markchunk: offset too large";
        unsigned ix= unsigned(ofs/_hdr.bytesperchunk);
        unsigned n= size/_hdr.bytesperchunk;
        if (_chunkmap.size()<ix+n)
            _chunkmap.resize(ix+n, FREECHUNK);

        chunkmap_t::iterator begin= _chunkmap.begin()+ix;
        chunkmap_t::iterator end= _chunkmap.begin()+ix+n;

        // note: msvc10 requires the explicit class scope ImgfsFile  for FREECHUNK
        if (type!=FREECHUNK && std::find_if(begin, end, [](chunktype_t t) { return t!=ImgfsFile::FREECHUNK; })!=end) {
            printf("markchunk, n=%d, type=%c\n", n, type);
            std::string str;
            std::for_each(begin, end, [&str](chunktype_t t){ str += (char)t; });
            printf("chunk %08llx+%08x is already: '%s'\n", ofs, size, str.c_str());

            // is 'str' correct, while the string below is not,
            //    -> because i did not declare the enum as ':char'
            //printf("chunk %08llx+%08x is already: '%s'\n", ofs, size, std::string((const char*)&(*begin), n).c_str());
        }
        std::fill_n(begin, n, type);
    }